

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int eval_predicate(lyxp_expr *exp,uint16_t *exp_idx,lyd_node *cur_node,lys_module *param_4,
                  lyxp_set *set,int options)

{
  uint8_t *puVar1;
  lyxp_set_nodes *plVar2;
  longdouble lVar3;
  byte bVar4;
  ushort uVar5;
  uint uVar6;
  int iVar7;
  char *pcVar8;
  void *__ptr;
  void *pvVar9;
  ulong uVar10;
  LY_ERR *pLVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  char *pcVar16;
  undefined4 uVar17;
  int iVar18;
  uint uVar19;
  undefined1 local_b8 [8];
  lyxp_set set2;
  uint local_78;
  uint local_48;
  
  if ('\x02' < ly_log_level) {
    pcVar16 = "parsed";
    if (set == (lyxp_set *)0x0) {
      pcVar16 = "skipped";
    }
    pcVar8 = print_token(exp->tokens[*exp_idx]);
    ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_predicate",pcVar16,pcVar8,
               (ulong)exp->expr_pos[*exp_idx]);
  }
  uVar6 = (uint)*exp_idx;
  uVar5 = *exp_idx + 1;
  *exp_idx = uVar5;
  if (set != (lyxp_set *)0x0) {
    if (set->type == LYXP_SET_NODE_SET) {
      iVar18 = set_sort(set,cur_node,options);
      if (1 < iVar18) {
        pLVar11 = ly_errno_location();
        *pLVar11 = LY_EINT;
        ly_log(LY_LLERR,"XPath set was expected to be sorted, but is not (%s).","eval_predicate");
      }
      uVar5 = *exp_idx;
      uVar10 = (ulong)uVar5;
      do {
        uVar13 = uVar10 & 0xffff;
        uVar6 = (uint)uVar10;
        uVar10 = (ulong)(uVar6 + 1);
      } while (exp->tokens[uVar13] != LYXP_TOKEN_BRACK2);
      local_78 = (uint)uVar5;
      iVar18 = (uVar6 & 0xffff) - local_78;
      __ptr = calloc((long)iVar18,8);
      if (__ptr != (void *)0x0) {
        for (uVar6 = 0; uVar6 = uVar6 & 0xffff, (int)uVar6 < iVar18; uVar6 = uVar6 + 1) {
          puVar1 = exp->repeat[uVar5 + uVar6];
          if (puVar1 != (uint8_t *)0x0) {
            bVar4 = 0;
            do {
              uVar10 = (ulong)bVar4;
              bVar4 = bVar4 + 1;
            } while (puVar1[uVar10] != '\0');
            pvVar9 = malloc((ulong)bVar4);
            *(void **)((long)__ptr + (ulong)uVar6 * 8) = pvVar9;
            if (pvVar9 == (void *)0x0) goto LAB_00166cbd;
            memcpy(pvVar9,puVar1,(ulong)bVar4);
          }
        }
        local_48 = 1;
        uVar12 = 0;
        uVar6 = set->used;
        set2.ctx_size = uVar6;
        while (uVar19 = uVar12 & 0xffff, uVar19 < uVar6) {
          local_b8._0_4_ = LYXP_SET_EMPTY;
          plVar2 = (set->val).nodes;
          uVar10 = (ulong)(uVar19 << 4);
          set_insert_node((lyxp_set *)local_b8,*(void **)((long)&plVar2->node + uVar10),
                          *(uint32_t *)((long)&plVar2->pos + uVar10),
                          *(lyxp_node_type *)((long)&plVar2->type + uVar10),0);
          set2.used = local_48;
          set2.size = set2.ctx_size;
          *exp_idx = uVar5;
          for (uVar6 = 0; uVar6 = uVar6 & 0xffff, (int)uVar6 < iVar18; uVar6 = uVar6 + 1) {
            pvVar9 = *(void **)((long)__ptr + (ulong)uVar6 * 8);
            if (pvVar9 != (void *)0x0) {
              bVar4 = 0;
              do {
                uVar10 = (ulong)bVar4;
                bVar4 = bVar4 + 1;
              } while (*(char *)((long)pvVar9 + uVar10) != '\0');
              memcpy(exp->repeat[uVar5 + uVar6],pvVar9,(ulong)bVar4);
            }
          }
          iVar7 = eval_expr(exp,exp_idx,cur_node,param_4,(lyxp_set *)local_b8,options);
          if (iVar7 != 0) {
            uVar6 = 0;
            while( true ) {
              uVar6 = uVar6 & 0xffff;
              if (iVar18 <= (int)uVar6) break;
              free(*(void **)((long)__ptr + (ulong)uVar6 * 8));
              uVar6 = uVar6 + 1;
            }
            free(__ptr);
            goto LAB_001670f3;
          }
          if (local_b8._0_4_ == LYXP_SET_NUMBER) {
            lVar3 = ROUND((longdouble)set2._8_10_);
            set2._8_10_ = (longdouble)0;
            if ((long)lVar3 == (ulong)local_48) {
              set2._8_10_ = (longdouble)1;
            }
          }
          lyxp_set_cast((lyxp_set *)local_b8,LYXP_SET_BOOLEAN,cur_node,param_4,options);
          if (set2._8_4_ == 0) {
            set_remove_node(set,uVar19);
          }
          else {
            uVar12 = uVar12 + 1;
          }
          local_48 = local_48 + 1;
          uVar6 = set->used;
        }
        uVar6 = 0;
        while( true ) {
          uVar6 = uVar6 & 0xffff;
          if (iVar18 <= (int)uVar6) break;
          free(*(void **)((long)__ptr + (ulong)uVar6 * 8));
          uVar6 = uVar6 + 1;
        }
LAB_00167034:
        free(__ptr);
        goto LAB_00167047;
      }
    }
    else {
      if (set->type != LYXP_SET_SNODE_SET) {
        local_b8._0_4_ = LYXP_SET_EMPTY;
        set_fill_set((lyxp_set *)local_b8,set);
        iVar7 = eval_expr(exp,exp_idx,cur_node,param_4,(lyxp_set *)local_b8,options);
        if (iVar7 != 0) {
LAB_001670f3:
          lyxp_set_cast((lyxp_set *)local_b8,LYXP_SET_EMPTY,cur_node,param_4,options);
          return iVar7;
        }
        lyxp_set_cast((lyxp_set *)local_b8,LYXP_SET_BOOLEAN,cur_node,param_4,options);
        if (set2._8_4_ == 0) {
          lyxp_set_cast(set,LYXP_SET_EMPTY,cur_node,param_4,options);
        }
        lyxp_set_cast((lyxp_set *)local_b8,LYXP_SET_EMPTY,cur_node,param_4,options);
        goto LAB_00167047;
      }
      do {
        uVar6 = uVar6 + 1;
      } while (exp->tokens[uVar6 & 0xffff] != LYXP_TOKEN_BRACK2);
      iVar18 = (uVar6 & 0xffff) - (uint)uVar5;
      __ptr = calloc((long)iVar18,8);
      if (__ptr != (void *)0x0) {
        uVar6 = 0;
        do {
          uVar6 = uVar6 & 0xffff;
          if (iVar18 <= (int)uVar6) {
            uVar10 = (ulong)set->used;
            uVar6 = 3;
            do {
              lVar14 = 0;
              do {
                if (uVar10 * 0x10 + 0x10 == lVar14 + 0x10) {
                  for (lVar14 = 0; uVar10 * 0x10 != lVar14; lVar14 = lVar14 + 0x10) {
                    if (*(int *)((long)&((set->val).nodes)->pos + lVar14) == 1) {
                      *(uint *)((long)&((set->val).nodes)->pos + lVar14) = uVar6;
                    }
                  }
                  for (uVar12 = 0; uVar19 = uVar12 & 0xffff, uVar19 < (uint)uVar10;
                      uVar12 = uVar12 + 1) {
                    if (*(uint *)((long)&((set->val).nodes)->pos + (ulong)(uVar19 << 4)) == uVar6) {
                      *(undefined4 *)((long)&((set->val).nodes)->pos + (ulong)(uVar19 << 4)) = 1;
                      *exp_idx = uVar5;
                      for (uVar15 = 0; uVar15 = uVar15 & 0xffff, (int)uVar15 < iVar18;
                          uVar15 = uVar15 + 1) {
                        pvVar9 = *(void **)((long)__ptr + (ulong)uVar15 * 8);
                        if (pvVar9 != (void *)0x0) {
                          bVar4 = 0;
                          do {
                            uVar10 = (ulong)bVar4;
                            bVar4 = bVar4 + 1;
                          } while (*(char *)((long)pvVar9 + uVar10) != '\0');
                          memcpy(exp->repeat[uVar5 + uVar15],pvVar9,(ulong)bVar4);
                        }
                      }
                      iVar7 = eval_expr(exp,exp_idx,cur_node,param_4,set,options);
                      if (iVar7 != 0) {
                        uVar6 = 0;
                        while( true ) {
                          uVar6 = uVar6 & 0xffff;
                          if (iVar18 <= (int)uVar6) break;
                          free(*(void **)((long)__ptr + (ulong)uVar6 * 8));
                          uVar6 = uVar6 + 1;
                        }
                        free(__ptr);
                        return iVar7;
                      }
                      *(uint *)((long)&((set->val).nodes)->pos + (ulong)(uVar19 << 4)) = uVar6;
                      uVar10 = (ulong)set->used;
                    }
                  }
                  for (lVar14 = 0; uVar10 << 4 != lVar14; lVar14 = lVar14 + 0x10) {
                    uVar12 = *(uint *)((long)&((set->val).nodes)->pos + lVar14);
                    uVar17 = 0;
                    if ((uVar12 == 1) || (uVar17 = 1, uVar12 == uVar6)) {
                      *(undefined4 *)((long)&((set->val).nodes)->pos + lVar14) = uVar17;
                    }
                  }
                  uVar10 = 0;
                  while( true ) {
                    iVar7 = (int)(uVar10 & 0xffff);
                    if (iVar18 <= iVar7) break;
                    free(*(void **)((long)__ptr + (uVar10 & 0xffff) * 8));
                    uVar10 = (ulong)(iVar7 + 1);
                  }
                  goto LAB_00167034;
                }
                uVar12 = *(uint *)((long)&((set->val).nodes)->pos + lVar14);
                lVar14 = lVar14 + 0x10;
              } while (uVar12 < uVar6);
              uVar6 = uVar12 + 1;
            } while( true );
          }
          puVar1 = exp->repeat[uVar5 + uVar6];
          if (puVar1 != (uint8_t *)0x0) {
            bVar4 = 0;
            do {
              uVar10 = (ulong)bVar4;
              bVar4 = bVar4 + 1;
            } while (puVar1[uVar10] != '\0');
            pvVar9 = malloc((ulong)bVar4);
            *(void **)((long)__ptr + (ulong)uVar6 * 8) = pvVar9;
            if (pvVar9 == (void *)0x0) {
LAB_00166cbd:
              pLVar11 = ly_errno_location();
              *pLVar11 = LY_EMEM;
              ly_log(LY_LLERR,"Memory allocation failed (%s()).","eval_predicate");
              free(__ptr);
              return -1;
            }
            memcpy(pvVar9,puVar1,(ulong)bVar4);
          }
          uVar6 = uVar6 + 1;
        } while( true );
      }
    }
    pLVar11 = ly_errno_location();
    *pLVar11 = LY_EMEM;
    ly_log(LY_LLERR,"Memory allocation failed (%s()).","eval_predicate");
    return -1;
  }
  iVar18 = eval_expr(exp,exp_idx,cur_node,param_4,(lyxp_set *)0x0,options);
  if (iVar18 != 0) {
    return iVar18;
  }
LAB_00167047:
  pcVar16 = "parsed";
  uVar5 = *exp_idx;
  if ('\x02' < ly_log_level) {
    if (set == (lyxp_set *)0x0) {
      pcVar16 = "skipped";
    }
    pcVar8 = print_token(exp->tokens[uVar5]);
    ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_predicate",pcVar16,pcVar8,
               (ulong)exp->expr_pos[*exp_idx]);
    uVar5 = *exp_idx;
  }
  *exp_idx = uVar5 + 1;
  return 0;
}

Assistant:

static int
eval_predicate(struct lyxp_expr *exp, uint16_t *exp_idx, struct lyd_node *cur_node, struct lys_module *local_mod,
               struct lyxp_set *set, int options)
{
    int ret;
    uint16_t i, j, orig_exp, brack2_exp;
    uint32_t orig_pos, orig_size, pred_in_ctx;
    uint8_t **pred_repeat, rep_size;
    struct lyxp_set set2;

    /* '[' */
    LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
           print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
    ++(*exp_idx);

    if (!set) {
        ret = eval_expr(exp, exp_idx, cur_node, local_mod, NULL, options);
        if (ret) {
            return ret;
        }
    } else if (set->type == LYXP_SET_NODE_SET) {
#ifndef NDEBUG
        /* we (possibly) need the set sorted, it can affect the result (if the predicate result is a number) */
        if (set_sort(set, cur_node, options) > 1) {
            LOGERR(LY_EINT, "XPath set was expected to be sorted, but is not (%s).", __func__);
        }
#endif

        orig_exp = *exp_idx;

        /* find the predicate end */
        for (brack2_exp = orig_exp; exp->tokens[brack2_exp] != LYXP_TOKEN_BRACK2; ++brack2_exp);

        /* copy predicate repeats, since they get deleted each time (probably not an ideal solution) */
        pred_repeat = calloc(brack2_exp - orig_exp, sizeof *pred_repeat);
        if (!pred_repeat) {
            LOGMEM;
            return -1;
        }
        for (j = 0; j < brack2_exp - orig_exp; ++j) {
            if (exp->repeat[orig_exp + j]) {
                for (rep_size = 0; exp->repeat[orig_exp + j][rep_size]; ++rep_size);
                ++rep_size;
                pred_repeat[j] = malloc(rep_size * sizeof **pred_repeat);
                if (!pred_repeat[j]) {
                    LOGMEM;
                    for (i = 0; i < j; ++i) {
                        free(pred_repeat[j]);
                    }
                    free(pred_repeat);
                    return -1;
                }
                memcpy(pred_repeat[j], exp->repeat[orig_exp + j], rep_size * sizeof **pred_repeat);
            }
        }

        orig_size = set->used;
        for (i = 0, orig_pos = 1; i < set->used; ++orig_pos) {
            set2.type = LYXP_SET_EMPTY;
            set_insert_node(&set2, set->val.nodes[i].node, set->val.nodes[i].pos, set->val.nodes[i].type, 0);
            /* remember the node context position for position() and context size for last() */
            set2.ctx_pos = orig_pos;
            set2.ctx_size = orig_size;
            *exp_idx = orig_exp;

            /* replace repeats */
            for (j = 0; j < brack2_exp - orig_exp; ++j) {
                if (pred_repeat[j]) {
                    for (rep_size = 0; pred_repeat[j][rep_size]; ++rep_size);
                    ++rep_size;
                    memcpy(exp->repeat[orig_exp + j], pred_repeat[j], rep_size * sizeof **pred_repeat);
                }
            }

            ret = eval_expr(exp, exp_idx, cur_node, local_mod, &set2, options);
            if (ret) {
                for (j = 0; j < brack2_exp - orig_exp; ++j) {
                    free(pred_repeat[j]);
                }
                free(pred_repeat);
                lyxp_set_cast(&set2, LYXP_SET_EMPTY, cur_node, local_mod, options);
                return ret;
            }

            /* number is a position */
            if (set2.type == LYXP_SET_NUMBER) {
                if ((long long)set2.val.num == orig_pos) {
                    set2.val.num = 1;
                } else {
                    set2.val.num = 0;
                }
            }
            lyxp_set_cast(&set2, LYXP_SET_BOOLEAN, cur_node, local_mod, options);

            /* predicate satisfied or not? */
            if (set2.val.bool) {
                ++i;
            } else {
                set_remove_node(set, i);
            }
        }

        /* free predicate repeats */
        for (j = 0; j < brack2_exp - orig_exp; ++j) {
            free(pred_repeat[j]);
        }
        free(pred_repeat);

    } else if (set->type == LYXP_SET_SNODE_SET) {
        orig_exp = *exp_idx;

        /* find the predicate end */
        for (brack2_exp = orig_exp; exp->tokens[brack2_exp] != LYXP_TOKEN_BRACK2; ++brack2_exp);

        /* copy predicate repeats, since they get deleted each time (probably not an ideal solution) */
        pred_repeat = calloc(brack2_exp - orig_exp, sizeof *pred_repeat);
        if (!pred_repeat) {
            LOGMEM;
            return -1;
        }
        for (j = 0; j < brack2_exp - orig_exp; ++j) {
            if (exp->repeat[orig_exp + j]) {
                for (rep_size = 0; exp->repeat[orig_exp + j][rep_size]; ++rep_size);
                ++rep_size;
                pred_repeat[j] = malloc(rep_size * sizeof **pred_repeat);
                if (!pred_repeat[j]) {
                    LOGMEM;
                    for (i = 0; i < j; ++i) {
                        free(pred_repeat[j]);
                    }
                    free(pred_repeat);
                    return -1;
                }
                memcpy(pred_repeat[j], exp->repeat[orig_exp + j], rep_size * sizeof **pred_repeat);
            }
        }

        /* set special in_ctx to all the valid snodes */
        pred_in_ctx = set_snode_new_in_ctx(set);

        /* use the valid snodes one-by-one */
        for (i = 0; i < set->used; ++i) {
            if (set->val.snodes[i].in_ctx != pred_in_ctx) {
                continue;
            }
            set->val.snodes[i].in_ctx = 1;

            *exp_idx = orig_exp;

            /* replace repeats */
            for (j = 0; j < brack2_exp - orig_exp; ++j) {
                if (pred_repeat[j]) {
                    for (rep_size = 0; pred_repeat[j][rep_size]; ++rep_size);
                    ++rep_size;
                    memcpy(exp->repeat[orig_exp + j], pred_repeat[j], rep_size * sizeof **pred_repeat);
                }
            }

            ret = eval_expr(exp, exp_idx, cur_node, local_mod, set, options);
            if (ret) {
                for (j = 0; j < brack2_exp - orig_exp; ++j) {
                    free(pred_repeat[j]);
                }
                free(pred_repeat);
                return ret;
            }

            set->val.snodes[i].in_ctx = pred_in_ctx;
        }

        /* restore the state as it was before the predicate */
        for (i = 0; i < set->used; ++i) {
            if (set->val.snodes[i].in_ctx == 1) {
                set->val.snodes[i].in_ctx = 0;
            } else if (set->val.snodes[i].in_ctx == pred_in_ctx) {
                set->val.snodes[i].in_ctx = 1;
            }
        }

        /* free predicate repeats */
        for (j = 0; j < brack2_exp - orig_exp; ++j) {
            free(pred_repeat[j]);
        }
        free(pred_repeat);
    } else {
        set2.type = LYXP_SET_EMPTY;
        set_fill_set(&set2, set);

        ret = eval_expr(exp, exp_idx, cur_node, local_mod, &set2, options);
        if (ret) {
            lyxp_set_cast(&set2, LYXP_SET_EMPTY, cur_node, local_mod, options);
            return ret;
        }

        lyxp_set_cast(&set2, LYXP_SET_BOOLEAN, cur_node, local_mod, options);
        if (!set2.val.bool) {
            lyxp_set_cast(set, LYXP_SET_EMPTY, cur_node, local_mod, options);
        }
        lyxp_set_cast(&set2, LYXP_SET_EMPTY, cur_node, local_mod, options);
    }

    /* ']' */
    LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
           print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
    ++(*exp_idx);

    return EXIT_SUCCESS;
}